

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::SpotLightSource::writeTo(SpotLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->from);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->to);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->I);
  (*(this->Ispectrum).super_Entity._vptr_Entity[1])(&this->Ispectrum,binary);
  BinaryWriter::write<float>(binary,&this->coneAngle);
  BinaryWriter::write<float>(binary,&this->coneDeltaAngle);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale);
  return 0x47;
}

Assistant:

int SpotLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(I);
    binary.write(Ispectrum);
    binary.write(coneAngle);
    binary.write(coneDeltaAngle);
    binary.write(scale);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }